

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  char *pcVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  uint uVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  _Alloc_hider _Var13;
  size_type sVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  string groups;
  char digits [40];
  string local_2a0;
  ulong local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a0,(locale_ref)(this->locale).locale_);
  if (local_2a0._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar6 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar6 == '\0') {
      on_dec(this);
    }
    else {
      uVar11 = this->abs_value;
      uVar7 = 0x1f;
      if ((uVar11 | 1) != 0) {
        for (; (uVar11 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar7 * 2);
      local_280 = (ulong)uVar3;
      uVar19 = (uint)uVar3 -
               (uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        local_280 * 4));
      iVar20 = -(uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         local_280 * 4));
      pcVar8 = local_2a0._M_dataplus._M_p + local_2a0._M_string_length;
      _Var13._M_p = local_2a0._M_dataplus._M_p;
      uVar7 = uVar19;
      uVar10 = uVar19;
      if (local_2a0._M_string_length != 0) {
        _Var12._M_p = local_2a0._M_dataplus._M_p;
        sVar14 = local_2a0._M_string_length;
        uVar21 = uVar19;
        do {
          cVar2 = *_Var12._M_p;
          uVar17 = uVar10 - (int)cVar2;
          _Var13._M_p = _Var12._M_p;
          uVar7 = uVar21;
          if ((uVar17 == 0 || (int)uVar10 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar21 = uVar21 + 1;
          _Var12._M_p = _Var12._M_p + 1;
          sVar14 = sVar14 - 1;
          _Var13._M_p = pcVar8;
          uVar7 = (int)local_2a0._M_string_length + (uint)uVar3 + iVar20;
          uVar10 = uVar17;
        } while (sVar14 != 0);
      }
      if (_Var13._M_p == pcVar8) {
        uVar7 = (int)(uVar10 - 1) / (int)pcVar8[-1] + uVar7;
      }
      pcVar8 = local_278 + (int)uVar19;
      uVar10 = uVar11;
      if (99 < uVar11) {
        do {
          uVar11 = uVar10 / 100;
          *(undefined2 *)(pcVar8 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (ulong)(uVar10 % 100) * 2);
          pcVar8 = pcVar8 + -2;
          bVar5 = 9999 < uVar10;
          uVar10 = uVar10 / 100;
        } while (bVar5);
      }
      if (uVar11 < 10) {
        pcVar8[-1] = (byte)uVar11 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar8 + -2) =
             *(undefined2 *)(&basic_data<void>::digits + (ulong)uVar11 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014acc8;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar7 = uVar7 + this->prefix_size;
      uVar22 = (ulong)uVar7;
      if (500 < uVar7) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar22);
      }
      pcVar8 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar22 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar22;
      }
      pcVar18 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar7 + -1;
      if (1 < (int)uVar19) {
        uVar15 = (ulong)uVar19;
        iVar16 = (int)local_280 + iVar20 + 1;
        iVar20 = 0;
        _Var13._M_p = local_2a0._M_dataplus._M_p;
        do {
          uVar15 = uVar15 - 1;
          pcVar1 = pcVar18 + -1;
          *pcVar18 = local_278[uVar15 & 0xffffffff];
          cVar2 = *_Var13._M_p;
          if ('\0' < cVar2) {
            iVar20 = iVar20 + 1;
            if ((cVar2 != '\x7f') && (iVar20 % (int)cVar2 == 0)) {
              if (_Var13._M_p + 1 != local_2a0._M_dataplus._M_p + local_2a0._M_string_length) {
                iVar20 = 0;
                _Var13._M_p = _Var13._M_p + 1;
              }
              pcVar18[-1] = cVar6;
              pcVar1 = pcVar18 + -2;
            }
          }
          pcVar18 = pcVar1;
          iVar16 = iVar16 + -1;
        } while (2 < iVar16);
      }
      *pcVar18 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar18[-1] = '-';
      }
      pbVar4 = this->specs;
      uVar15 = 0;
      if (uVar22 <= (uint)pbVar4->width) {
        uVar15 = (uint)pbVar4->width - uVar22;
      }
      uVar22 = uVar15 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        ((this->out).container,uVar22,&pbVar4->fill);
      bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (pcVar8,pcVar8 + (int)uVar7,bVar9);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (bVar9,uVar15 - uVar22,&pbVar4->fill);
      (this->out).container = bVar9.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }